

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
spvtools::val::Instruction::Instruction(Instruction *this,spv_parsed_instruction_t *inst)

{
  ushort uVar1;
  uint32_t *puVar2;
  spv_parsed_operand_t *psVar3;
  pointer psVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  
  puVar2 = inst->words;
  uVar1 = inst->num_words;
  (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,puVar2,puVar2 + uVar1);
  psVar3 = inst->operands;
  uVar1 = inst->num_operands;
  (this->operands_).super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operands_).super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands_).super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
  _M_range_initialize<spv_parsed_operand_t_const*>
            ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>> *)&this->operands_,
             psVar3,psVar3 + uVar1);
  psVar4 = (this->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->inst_).words =
       (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar5 = inst->opcode;
  (this->inst_).num_words = inst->num_words;
  (this->inst_).opcode = uVar5;
  uVar6 = inst->type_id;
  (this->inst_).ext_inst_type = inst->ext_inst_type;
  (this->inst_).type_id = uVar6;
  (this->inst_).result_id = inst->result_id;
  (this->inst_).operands = psVar4;
  (this->inst_).num_operands = inst->num_operands;
  this->line_num_ = 0;
  this->function_ = (Function *)0x0;
  this->block_ = (BasicBlock *)0x0;
  (this->uses_).
  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uses_).
  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uses_).
  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Instruction::Instruction(const spv_parsed_instruction_t* inst)
    : words_(inst->words, inst->words + inst->num_words),
      operands_(inst->operands, inst->operands + inst->num_operands),
      inst_({words_.data(), inst->num_words, inst->opcode, inst->ext_inst_type,
             inst->type_id, inst->result_id, operands_.data(),
             inst->num_operands}) {}